

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint64_t helper_neon_mull_u8_arm(uint32_t a,uint32_t b)

{
  return CONCAT44((b >> 0x10 & 0xff) * (a >> 0x10 & 0xff),
                  (a & 0xff00) * 0x100 * (b >> 8 & 0xff) | (b & 0xff) * (a & 0xff)) |
         (ulong)((b >> 0x18) * (a >> 0x18)) << 0x30;
}

Assistant:

uint64_t HELPER(neon_mull_u8)(uint32_t a, uint32_t b)
{
    uint64_t tmp;
    uint64_t result;

    DO_MULL(result, a, b, uint8_t, uint16_t);
    DO_MULL(tmp, a >> 8, b >> 8, uint8_t, uint16_t);
    result |= tmp << 16;
    DO_MULL(tmp, a >> 16, b >> 16, uint8_t, uint16_t);
    result |= tmp << 32;
    DO_MULL(tmp, a >> 24, b >> 24, uint8_t, uint16_t);
    result |= tmp << 48;
    return result;
}